

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elempatch.c
# Opt level: O2

void fill_func3(int nelem,int type,void *buf)

{
  undefined8 *puVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  switch(type) {
  case 0x3e9:
    uVar2 = 0;
    uVar4 = (ulong)(uint)nelem;
    if (nelem < 1) {
      uVar4 = uVar2;
    }
    for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      *(undefined4 *)((long)buf + uVar2 * 4) = 2;
    }
    break;
  case 0x3ea:
    uVar2 = 0;
    uVar4 = (ulong)(uint)nelem;
    if (nelem < 1) {
      uVar4 = uVar2;
    }
    for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      *(undefined8 *)((long)buf + uVar2 * 8) = 2;
    }
    break;
  case 0x3eb:
    uVar2 = 0;
    uVar4 = (ulong)(uint)nelem;
    if (nelem < 1) {
      uVar4 = uVar2;
    }
    for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      *(undefined4 *)((long)buf + uVar2 * 4) = 0x40000000;
    }
    break;
  case 0x3ec:
    uVar2 = 0;
    uVar4 = (ulong)(uint)nelem;
    if (nelem < 1) {
      uVar4 = uVar2;
    }
    for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      *(undefined8 *)((long)buf + uVar2 * 8) = 0x4000000000000000;
    }
    break;
  default:
    GA_Error(" wrong data type ",type);
    return;
  case 0x3ee:
    for (lVar3 = 0; lVar3 < nelem * 2 + -1; lVar3 = lVar3 + 2) {
      *(undefined8 *)((long)buf + lVar3 * 4) = 0x403504f3;
    }
    break;
  case 0x3ef:
    for (lVar3 = 0; lVar3 < nelem * 2 + -1; lVar3 = lVar3 + 2) {
      puVar1 = (undefined8 *)((long)buf + lVar3 * 8);
      *puVar1 = 0x4006a09e667f3bcd;
      puVar1[1] = 0;
    }
  }
  return;
}

Assistant:

void
fill_func3 (int nelem, int type, void *buf)
  /*taking the absolute of the ifun() */
{
  /*int i,size=MA_sizeof(MT_CHAR,type,1);*/

  int i;

  switch (type)
  {
    case C_FLOAT:
      for (i = 0; i < nelem; i++)
        ((float *) buf)[i] = (float) GA_ABS (ifun (i));
      break;
    case C_LONG:
      for (i = 0; i < nelem; i++)
        ((long *) buf)[i] = (long) GA_ABS (ifun (i));
      break;
    case C_DBL:
      for (i = 0; i < nelem; i++)
        ((double *) buf)[i] = (double) GA_ABS (ifun (i));
      break;
    case C_DCPL:
      for (i = 0; i < 2 * nelem - 1; i = i + 2)
      {
        ((double *) buf)[i] =
          sqrt ((double)
              (ifun (i) * ifun (i) + ifun (i + 1) * ifun (i + 1)));
        ((double *) buf)[i + 1] = 0.0;
      }
      break;
    case C_SCPL:
      for (i = 0; i < 2 * nelem - 1; i = i + 2)
      {
        ((float *) buf)[i] =
          sqrt ((float)
              (ifun (i) * ifun (i) + ifun (i + 1) * ifun (i + 1)));
        ((float *) buf)[i + 1] = 0.0;
      }
      break;
    case C_INT:
      for (i = 0; i < nelem; i++)
        ((int *) buf)[i] = GA_ABS (ifun (i));
      break;
    default:
      GA_Error (" wrong data type ", type);

  }
}